

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O2

void Ptex::v2_2::anon_unknown_4::ApplyN<unsigned_char>
               (PtexSeparableKernel *k,float *result,void *data,int nChan,int nTxChan)

{
  float fVar1;
  byte bVar2;
  long lVar3;
  float *pfVar4;
  float *val;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  uchar *val_00;
  long lVar9;
  undefined8 uStack_80;
  float afStack_78 [2];
  float *local_70;
  uchar *local_68;
  uchar *local_60;
  float *local_58;
  PtexSeparableKernel *local_50;
  long local_48;
  float *local_40;
  VecMultN<unsigned_char> local_37;
  VecAccumN<unsigned_char> local_36;
  VecAccumN<float> local_35;
  int local_34;
  
  lVar3 = -((long)nChan * 4 + 0xfU & 0xfffffffffffffff0);
  local_40 = (float *)((long)afStack_78 + lVar3);
  bVar2 = (k->res).ulog2;
  iVar5 = nTxChan << (bVar2 & 0x1f);
  iVar8 = k->uw * nTxChan;
  pfVar6 = k->kv;
  val_00 = (uchar *)((long)(((k->v << (bVar2 & 0x1f)) + k->u) * nTxChan) + (long)data);
  local_60 = val_00 + (long)iVar5 * (long)k->vw;
  local_48 = (long)(iVar5 - iVar8);
  local_58 = result;
  local_50 = k;
  local_34 = nChan;
  while (iVar5 = local_34, pfVar4 = local_40, val_00 != local_60) {
    pfVar7 = local_50->ku;
    local_68 = val_00 + iVar8;
    fVar1 = *pfVar7;
    local_70 = pfVar6;
    *(undefined8 *)((long)&uStack_80 + lVar3) = 0x56a334;
    PtexUtils::VecMultN<unsigned_char>::operator()(&local_37,pfVar4,val_00,iVar5,fVar1);
    for (lVar9 = (long)nTxChan; iVar5 = local_34, val = local_40, pfVar4 = local_58,
        pfVar7 = pfVar7 + 1, iVar8 != lVar9; lVar9 = lVar9 + nTxChan) {
      fVar1 = *pfVar7;
      *(undefined8 *)((long)&uStack_80 + lVar3) = 0x56a358;
      PtexUtils::VecAccumN<unsigned_char>::operator()(&local_36,val,val_00 + lVar9,iVar5,fVar1);
    }
    fVar1 = *local_70;
    pfVar6 = local_70 + 1;
    *(undefined8 *)((long)&uStack_80 + lVar3) = 0x56a381;
    PtexUtils::VecAccumN<float>::operator()(&local_35,pfVar4,val,iVar5,fVar1);
    val_00 = local_68 + local_48;
  }
  return;
}

Assistant:

void ApplyN(PtexSeparableKernel& k, float* result, void* data, int nChan, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMultN<T>()(rowResult, p, nChan, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccumN<T>()(rowResult, p, nChan, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccumN<float>()(result, rowResult, nChan, *kvp++);
            p += rowskip;
        }
    }